

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O2

float_t djb::beckmann::erfinv(float_t u)

{
  float fVar1;
  
  if ((u == -1.0) && (!NAN(u))) {
    return -INFINITY;
  }
  if ((u == 1.0) && (!NAN(u))) {
    return INFINITY;
  }
  fVar1 = logf((1.0 - u) * (u + 1.0));
  if (fVar1 <= -5.0) {
    if (-0.0 < fVar1) {
      fVar1 = sqrtf(-fVar1);
    }
    else {
      fVar1 = SQRT(-fVar1);
    }
    fVar1 = fVar1 + -3.0;
    fVar1 = (((((((fVar1 * -0.00020021426 + 0.00010095056) * fVar1 + 0.0013493432) * fVar1 +
                -0.0036734284) * fVar1 + 0.0057395077) * fVar1 + -0.0076224613) * fVar1 +
             0.0094388705) * fVar1 + 1.001674) * fVar1 + 2.8329768;
  }
  else {
    fVar1 = -2.5 - fVar1;
    fVar1 = (((((((fVar1 * 2.8102264e-08 + 3.4327394e-07) * fVar1 + -3.5233877e-06) * fVar1 +
                -4.3915065e-06) * fVar1 + 0.00021858087) * fVar1 + -0.001253725) * fVar1 +
             -0.0041776816) * fVar1 + 0.24664073) * fVar1 + 1.5014094;
  }
  return fVar1 * u;
}

Assistant:

float_t beckmann::erfinv(float_t u)
{
	if (u == -1)
		return -std::numeric_limits<float>::infinity();
	else if (u == 1)
		return +std::numeric_limits<float>::infinity();
	else {
		float_t w, p;

		w = -logf((1 - u) * (1 + u));
		if (w < (float_t)5.0) {
			w = w - (float_t)2.500000;
			p = (float_t)2.81022636e-08;
			p = (float_t)3.43273939e-07 + p * w;
			p = (float_t)-3.5233877e-06 + p * w;
			p = (float_t)-4.39150654e-06 + p * w;
			p = (float_t)0.00021858087 + p * w;
			p = (float_t)-0.00125372503 + p * w;
			p = (float_t)-0.00417768164 + p * w;
			p = (float_t)0.246640727 + p * w;
			p = (float_t)1.50140941 + p * w;
		} else {
			w = sqrt(w) - (float_t)3.0;
			p = (float_t)-0.000200214257;
			p = (float_t)0.000100950558 + p * w;
			p = (float_t)0.00134934322 + p * w;
			p = (float_t)-0.00367342844 + p * w;
			p = (float_t)0.00573950773 + p * w;
			p = (float_t)-0.0076224613 + p * w;
			p = (float_t)0.00943887047 + p * w;
			p = (float_t)1.00167406 + p * w;
			p = (float_t)2.83297682 + p * w;
		}

		return p * u;
	}
}